

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtPolyhedralContactClipping.cpp
# Opt level: O1

void cbtPolyhedralContactClipping::clipHullAgainstHull
               (cbtVector3 *separatingNormal1,cbtConvexPolyhedron *hullA,cbtConvexPolyhedron *hullB,
               cbtTransform *transA,cbtTransform *transB,cbtScalar minDist,cbtScalar maxDist,
               cbtVertexArray *worldVertsB1,cbtVertexArray *worldVertsB2,Result *resultOut)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  cbtScalar cVar3;
  cbtScalar cVar4;
  float fVar5;
  int iVar6;
  undefined8 uVar7;
  ulong uVar8;
  cbtVector3 *pcVar9;
  cbtScalar *pcVar10;
  ulong uVar11;
  cbtFace *pcVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  undefined1 auVar24 [64];
  cbtVector3 separatingNormal;
  cbtVector3 local_68;
  cbtConvexPolyhedron *local_58;
  cbtTransform *local_50;
  long local_48;
  cbtFace *local_40;
  cbtConvexPolyhedron *local_38;
  
  uVar8 = *(ulong *)separatingNormal1->m_floats;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar8;
  uVar11 = *(ulong *)(separatingNormal1->m_floats + 2);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar11;
  auVar18 = vmovshdup_avx(auVar22);
  fVar23 = auVar18._0_4_;
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * fVar23)),auVar22,auVar22);
  auVar18 = vfmadd231ss_fma(auVar18,auVar19,auVar19);
  local_58 = hullA;
  local_50 = transA;
  if (auVar18._0_4_ < 0.0) {
    fVar20 = sqrtf(auVar18._0_4_);
  }
  else {
    auVar18 = vsqrtss_avx(auVar18,auVar18);
    fVar20 = auVar18._0_4_;
  }
  fVar20 = 1.0 / fVar20;
  auVar22 = vinsertps_avx(ZEXT416((uint)((float)uVar8 * fVar20)),ZEXT416((uint)(fVar23 * fVar20)),
                          0x10);
  auVar18 = vblendps_avx(ZEXT416((uint)((float)uVar11 * fVar20)),auVar19,2);
  local_68.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar22,auVar18);
  uVar8 = (ulong)(hullB->m_faces).m_size;
  if ((long)uVar8 < 1) {
    iVar15 = -1;
  }
  else {
    pcVar10 = ((hullB->m_faces).m_data)->m_plane + 2;
    auVar24 = ZEXT464(0xff7fffff);
    uVar16 = 0xffffffff;
    uVar11 = 0;
    do {
      cVar3 = pcVar10[-2];
      fVar23 = pcVar10[-1];
      cVar4 = *pcVar10;
      auVar18 = vmulss_avx512f(ZEXT416((uint)fVar23),
                               ZEXT416((uint)(transB->m_basis).m_el[0].m_floats[1]));
      auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)(transB->m_basis).m_el[0].m_floats[0]),
                                    ZEXT416((uint)cVar3));
      auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)(transB->m_basis).m_el[0].m_floats[2]),
                                    ZEXT416((uint)cVar4));
      auVar19 = vmulss_avx512f(ZEXT416((uint)fVar23),
                               ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[1]));
      auVar19 = vfmadd231ss_avx512f(auVar19,ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[0]),
                                    ZEXT416((uint)cVar3));
      auVar19 = vfmadd231ss_avx512f(auVar19,ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[2]),
                                    ZEXT416((uint)cVar4));
      auVar19 = vmulss_avx512f(auVar19,ZEXT416((uint)local_68.m_floats[1]));
      auVar19 = vfmadd231ss_avx512f(auVar19,ZEXT416((uint)local_68.m_floats[0]),auVar18);
      auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * (transB->m_basis).m_el[2].m_floats[1])),
                                ZEXT416((uint)(transB->m_basis).m_el[2].m_floats[0]),
                                ZEXT416((uint)cVar3));
      auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)(transB->m_basis).m_el[2].m_floats[2]),
                                ZEXT416((uint)cVar4));
      auVar19 = vfmadd213ss_avx512f(auVar18,ZEXT416((uint)local_68.m_floats[2]),auVar19);
      fVar23 = auVar24._0_4_;
      auVar18 = vmaxss_avx(auVar19,auVar24._0_16_);
      auVar24 = ZEXT1664(auVar18);
      if (fVar23 < auVar19._0_4_) {
        uVar16 = uVar11 & 0xffffffff;
      }
      iVar15 = (int)uVar16;
      uVar11 = uVar11 + 1;
      pcVar10 = pcVar10 + 0xc;
    } while (uVar8 != uVar11);
  }
  if ((worldVertsB1->m_size < 0) && (worldVertsB1->m_capacity < 0)) {
    if (worldVertsB1->m_data != (cbtVector3 *)0x0) {
      if (worldVertsB1->m_ownsMemory == true) {
        cbtAlignedFreeInternal(worldVertsB1->m_data);
      }
      worldVertsB1->m_data = (cbtVector3 *)0x0;
    }
    worldVertsB1->m_ownsMemory = true;
    worldVertsB1->m_data = (cbtVector3 *)0x0;
    worldVertsB1->m_capacity = 0;
  }
  worldVertsB1->m_size = 0;
  pcVar12 = (hullB->m_faces).m_data;
  lVar13 = (long)pcVar12[iVar15].m_indices.m_size;
  if (0 < lVar13) {
    pcVar12 = pcVar12 + iVar15;
    lVar14 = 0;
    auVar24 = ZEXT1264(ZEXT812(0));
    local_48 = lVar13;
    local_40 = pcVar12;
    local_38 = hullB;
    do {
      iVar6 = (pcVar12->m_indices).m_data[lVar14];
      pcVar9 = (hullB->m_vertices).m_data;
      cVar3 = pcVar9[iVar6].m_floats[0];
      fVar23 = pcVar9[iVar6].m_floats[1];
      auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * (transB->m_basis).m_el[0].m_floats[1])),
                                ZEXT416((uint)cVar3),
                                ZEXT416((uint)(transB->m_basis).m_el[0].m_floats[0]));
      cVar4 = pcVar9[iVar6].m_floats[2];
      auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)cVar4),
                                ZEXT416((uint)(transB->m_basis).m_el[0].m_floats[2]));
      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * (transB->m_basis).m_el[1].m_floats[1])),
                                ZEXT416((uint)cVar3),
                                ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[0]));
      auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)cVar4),
                                ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[2]));
      auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * (transB->m_basis).m_el[2].m_floats[1])),
                                ZEXT416((uint)cVar3),
                                ZEXT416((uint)(transB->m_basis).m_el[2].m_floats[0]));
      auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)cVar4),
                                ZEXT416((uint)(transB->m_basis).m_el[2].m_floats[2]));
      fVar23 = (transB->m_origin).m_floats[0];
      fVar20 = (transB->m_origin).m_floats[1];
      fVar5 = (transB->m_origin).m_floats[2];
      iVar6 = worldVertsB1->m_size;
      if (iVar6 == worldVertsB1->m_capacity) {
        iVar17 = iVar6 * 2;
        if (iVar6 == 0) {
          iVar17 = 1;
        }
        if (worldVertsB1->m_capacity < iVar17) {
          if (iVar17 == 0) {
            pcVar9 = (cbtVector3 *)0x0;
          }
          else {
            pcVar9 = (cbtVector3 *)cbtAlignedAllocInternal((long)iVar17 << 4,0x10);
          }
          iVar6 = worldVertsB1->m_size;
          if (0 < (long)iVar6) {
            lVar13 = 0;
            do {
              puVar1 = (undefined8 *)((long)worldVertsB1->m_data->m_floats + lVar13);
              uVar7 = puVar1[1];
              puVar2 = (undefined8 *)((long)pcVar9->m_floats + lVar13);
              *puVar2 = *puVar1;
              puVar2[1] = uVar7;
              lVar13 = lVar13 + 0x10;
            } while ((long)iVar6 * 0x10 != lVar13);
          }
          auVar24 = ZEXT1264(ZEXT812(0));
          if (worldVertsB1->m_data != (cbtVector3 *)0x0) {
            if (worldVertsB1->m_ownsMemory == true) {
              cbtAlignedFreeInternal(worldVertsB1->m_data);
              auVar24 = ZEXT1264(ZEXT812(0));
            }
            worldVertsB1->m_data = (cbtVector3 *)0x0;
          }
          worldVertsB1->m_ownsMemory = true;
          worldVertsB1->m_data = pcVar9;
          worldVertsB1->m_capacity = iVar17;
          pcVar12 = local_40;
          hullB = local_38;
          lVar13 = local_48;
        }
      }
      auVar18 = vinsertps_avx(ZEXT416((uint)(auVar18._0_4_ + fVar23)),
                              ZEXT416((uint)(auVar19._0_4_ + fVar20)),0x10);
      auVar21._4_12_ = auVar24._4_12_;
      auVar21._0_4_ = auVar22._0_4_ + fVar5;
      auVar18 = vmovlhps_avx(auVar18,auVar21);
      *(undefined1 (*) [16])worldVertsB1->m_data[worldVertsB1->m_size].m_floats = auVar18;
      worldVertsB1->m_size = worldVertsB1->m_size + 1;
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar13);
  }
  if (-1 < iVar15) {
    clipFaceAgainstHull(&local_68,local_58,local_50,worldVertsB1,worldVertsB2,minDist,maxDist,
                        resultOut);
  }
  return;
}

Assistant:

void cbtPolyhedralContactClipping::clipHullAgainstHull(const cbtVector3& separatingNormal1, const cbtConvexPolyhedron& hullA, const cbtConvexPolyhedron& hullB, const cbtTransform& transA, const cbtTransform& transB, const cbtScalar minDist, cbtScalar maxDist, cbtVertexArray& worldVertsB1, cbtVertexArray& worldVertsB2, cbtDiscreteCollisionDetectorInterface::Result& resultOut)
{
	cbtVector3 separatingNormal = separatingNormal1.normalized();
	//	const cbtVector3 c0 = transA * hullA.m_localCenter;
	//	const cbtVector3 c1 = transB * hullB.m_localCenter;
	//const cbtVector3 DeltaC2 = c0 - c1;

	int closestFaceB = -1;
	cbtScalar dmax = -FLT_MAX;
	{
		for (int face = 0; face < hullB.m_faces.size(); face++)
		{
			const cbtVector3 Normal(hullB.m_faces[face].m_plane[0], hullB.m_faces[face].m_plane[1], hullB.m_faces[face].m_plane[2]);
			const cbtVector3 WorldNormal = transB.getBasis() * Normal;
			cbtScalar d = WorldNormal.dot(separatingNormal);
			if (d > dmax)
			{
				dmax = d;
				closestFaceB = face;
			}
		}
	}
	worldVertsB1.resize(0);
	{
		const cbtFace& polyB = hullB.m_faces[closestFaceB];
		const int numVertices = polyB.m_indices.size();
		for (int e0 = 0; e0 < numVertices; e0++)
		{
			const cbtVector3& b = hullB.m_vertices[polyB.m_indices[e0]];
			worldVertsB1.push_back(transB * b);
		}
	}

	if (closestFaceB >= 0)
		clipFaceAgainstHull(separatingNormal, hullA, transA, worldVertsB1, worldVertsB2, minDist, maxDist, resultOut);
}